

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cover_graph.hh
# Opt level: O3

void __thiscall
tchecker::graph::cover::
graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_hash_t,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_le_t>
::
covered_nodes<std::back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>>>>>
          (graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_hash_t,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_le_t>
           *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
                 *n,
          back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
          *ins)

{
  long lVar1;
  value_type *pvVar2;
  node_t *n1;
  node_t *n2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  node_le_t *this_00;
  __normal_iterator<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_*,_std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  __end0;
  __normal_iterator<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_*,_std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  __begin0;
  value_type *__x;
  
  if ((node_t *)n->_t != (node_t *)0x0) {
    this_00 = (node_le_t *)this;
    sVar4 = tck_reach::zg_covreach::node_hash_t::operator()((node_hash_t *)this,(node_t *)n->_t);
    lVar1 = *(long *)this;
    uVar5 = sVar4 % (ulong)((*(long *)(this + 8) - lVar1 >> 3) * -0x5555555555555555) & 0xffffffff;
    __x = *(value_type **)(lVar1 + uVar5 * 0x18);
    pvVar2 = *(value_type **)(lVar1 + 8 + uVar5 * 0x18);
    do {
      if (__x == pvVar2) {
        return;
      }
      n1 = (node_t *)__x->_t;
      n2 = (node_t *)n->_t;
      if (n1 != n2) {
        if ((n1 == (node_t *)0x0) || (n2 == (node_t *)0x0)) break;
        bVar3 = tck_reach::zg_covreach::node_le_t::operator()(this_00,n1,n2);
        if (bVar3) {
          this_00 = (node_le_t *)ins->container;
          std::
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::push_back((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
                       *)this_00,__x);
        }
      }
      __x = __x + 1;
    } while( true );
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,
                "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>>::operator*() const [T = tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>]"
               );
}

Assistant:

void covered_nodes(NODE_SPTR const & n, INSERTER & ins) const
  {
    auto && range = _nodes.collision_range(n);
    for (NODE_SPTR const & node : range)
      if ((node != n) && _node_le(node, n))
        ins = node;
  }